

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void reg_alloc(gen_ctx_t gen_ctx)

{
  uint uVar1;
  FILE *__stream;
  MIR_reg_t MVar2;
  MIR_reg_t MVar3;
  size_t sVar4;
  live_range_t_conflict plVar5;
  int simplified_p;
  MIR_reg_t max_var;
  MIR_reg_t reg;
  gen_ctx_t gen_ctx_local;
  
  MVar2 = get_max_var(gen_ctx);
  uVar1 = gen_ctx->optimize_level;
  build_live_ranges(gen_ctx);
  assign(gen_ctx);
  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fprintf((FILE *)gen_ctx->debug_file,"+++++++++++++Disposition after assignment:");
    for (simplified_p = 0x22; (uint)simplified_p <= MVar2; simplified_p = simplified_p + 1) {
      if ((simplified_p - 0x20U & 7) == 0) {
        fprintf((FILE *)gen_ctx->debug_file,"\n");
      }
      fprintf((FILE *)gen_ctx->debug_file," %3u=>",(ulong)(uint)simplified_p);
      sVar4 = VARR_live_range_tlength(gen_ctx->lr_ctx->var_live_ranges);
      if ((uint)simplified_p < sVar4) {
        plVar5 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,(ulong)(uint)simplified_p);
        if (plVar5 == (live_range_t_conflict)0x0) goto LAB_0013e08e;
        __stream = (FILE *)gen_ctx->debug_file;
        MVar3 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(ulong)(uint)simplified_p);
        fprintf(__stream,"%-2u",(ulong)MVar3);
      }
      else {
LAB_0013e08e:
        fprintf((FILE *)gen_ctx->debug_file,"UA");
      }
    }
    fprintf((FILE *)gen_ctx->debug_file,"\n");
  }
  rewrite(gen_ctx);
  if (1 < uVar1) {
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"+++++++++++++Spill info:\n");
      print_CFG(gen_ctx,1,0,0,0,output_bb_spill_info);
    }
    split(gen_ctx);
  }
  free_func_live_ranges(gen_ctx);
  return;
}

Assistant:

static void reg_alloc (gen_ctx_t gen_ctx) {
  MIR_reg_t reg, max_var = get_max_var (gen_ctx);
  const int simplified_p = ONLY_SIMPLIFIED_RA || optimize_level < 2;

  build_live_ranges (gen_ctx);
  assign (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++Disposition after assignment:");
    for (reg = MAX_HARD_REG + 1; reg <= max_var; reg++) {
      if ((reg - MAX_HARD_REG + 1) % 8 == 0) fprintf (debug_file, "\n");
      fprintf (debug_file, " %3u=>", reg);
      if (VARR_LENGTH (live_range_t, var_live_ranges) <= reg
          || VARR_GET (live_range_t, var_live_ranges, reg) == NULL)
        fprintf (debug_file, "UA");
      else
        fprintf (debug_file, "%-2u", VARR_GET (MIR_reg_t, reg_renumber, reg));
    }
    fprintf (debug_file, "\n");
  });
  rewrite (gen_ctx); /* After rewrite the BB live info is invalid as it is used for spill info */
  if (!simplified_p) {
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++Spill info:\n");
      print_CFG (gen_ctx, TRUE, FALSE, FALSE, FALSE, output_bb_spill_info);
    });
    split (gen_ctx);
  }
  free_func_live_ranges (gen_ctx);
}